

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

Orientation p2t::Orient2d(Point *pa,Point *pb,Point *pc)

{
  double dVar1;
  double val;
  double detright;
  double detleft;
  Point *pc_local;
  Point *pb_local;
  Point *pa_local;
  
  dVar1 = (pa->x - pc->x) * (pb->y - pc->y) - (pa->y - pc->y) * (pb->x - pc->x);
  if ((dVar1 <= -1e-12) || (1e-12 <= dVar1)) {
    if (dVar1 <= 0.0) {
      pa_local._4_4_ = CW;
    }
    else {
      pa_local._4_4_ = CCW;
    }
  }
  else {
    pa_local._4_4_ = COLLINEAR;
  }
  return pa_local._4_4_;
}

Assistant:

Orientation Orient2d(const Point& pa, const Point& pb, const Point& pc)
{
  double detleft = (pa.x - pc.x) * (pb.y - pc.y);
  double detright = (pa.y - pc.y) * (pb.x - pc.x);
  double val = detleft - detright;
  if (val > -EPSILON && val < EPSILON) {
    return COLLINEAR;
  } else if (val > 0) {
    return CCW;
  }
  return CW;
}